

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_pack(REF_GRID ref_grid)

{
  uint uVar1;
  long lVar2;
  REF_INT *o2n;
  REF_INT *n2o;
  REF_EDGE ref_edge;
  REF_INT *local_48;
  REF_INT *local_40;
  REF_EDGE local_38;
  
  uVar1 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar1 == 0) {
    uVar1 = ref_edge_create(&local_38,ref_grid);
    if (uVar1 == 0) {
      uVar1 = ref_edge_rcm(local_38,&local_48,&local_40);
      if (uVar1 == 0) {
        uVar1 = ref_edge_free(local_38);
        if (uVar1 == 0) {
          uVar1 = ref_node_pack(ref_grid->node,local_48,local_40);
          if (uVar1 == 0) {
            lVar2 = 0;
            do {
              uVar1 = ref_cell_pack(ref_grid->cell[lVar2],local_48);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0xb0,"ref_grid_pack",(ulong)uVar1,"pack cell");
                return uVar1;
              }
              lVar2 = lVar2 + 1;
            } while (lVar2 != 0x10);
            uVar1 = ref_geom_pack(ref_grid->geom,local_48);
            if (uVar1 == 0) {
              uVar1 = ref_interp_pack(ref_grid->interp,local_40);
              if (uVar1 == 0) {
                if (local_40 != (REF_INT *)0x0) {
                  free(local_40);
                }
                uVar1 = 0;
                if (local_48 != (REF_INT *)0x0) {
                  free(local_48);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0xb6,"ref_grid_pack",(ulong)uVar1,"pack interp");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0xb4,"ref_grid_pack",(ulong)uVar1,"pack geom");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0xad,"ref_grid_pack",(ulong)uVar1,"pack node");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0xaa,"ref_grid_pack",(ulong)uVar1,"free edge");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xa9
               ,"ref_grid_pack",(ulong)uVar1,"compact");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xa8,
             "ref_grid_pack",(ulong)uVar1,"create edge");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xa6,
           "ref_grid_pack",(ulong)uVar1,"sync globals");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_pack(REF_GRID ref_grid) {
  REF_INT group;
  REF_INT *o2n, *n2o;
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_BOOL timing = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync globals");

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_edge_rcm(ref_edge, &o2n, &n2o), "compact");
  RSS(ref_edge_free(ref_edge), "free edge");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack rcm");

  RSS(ref_node_pack(ref_grid_node(ref_grid), o2n, n2o), "pack node");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack node");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_pack(ref_cell, o2n), "pack cell");
  }
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack cell");

  RSS(ref_geom_pack(ref_grid_geom(ref_grid), o2n), "pack geom");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack geom");
  RSS(ref_interp_pack(ref_grid_interp(ref_grid), n2o), "pack interp");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack interp");

  ref_free(n2o);
  ref_free(o2n);

  return REF_SUCCESS;
}